

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_kry.c
# Opt level: O0

int jactimes(N_Vector v,N_Vector Jv,N_Vector u,int *new_u,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int j;
  int i;
  sunrealtype *Jvdata;
  sunrealtype *vdata;
  sunrealtype vrt;
  sunrealtype vlt;
  sunrealtype vup;
  sunrealtype vdn;
  sunrealtype vij;
  sunrealtype vdc;
  sunrealtype hdc;
  sunrealtype vdiff;
  sunrealtype hdiff;
  sunrealtype dy;
  sunrealtype dx;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 local_94;
  
  lVar2 = N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  for (local_98 = 1; local_98 < 0x20; local_98 = local_98 + 1) {
    for (local_94 = 1; local_94 < 0x20; local_94 = local_94 + 1) {
      dVar1 = *(double *)(lVar2 + (long)(local_98 + -1 + (local_94 + -1) * 0x1f) * 8);
      if (local_98 == 1) {
        local_a0 = 0.0;
      }
      else {
        local_a0 = *(double *)(lVar2 + (long)(local_98 + -2 + (local_94 + -1) * 0x1f) * 8);
      }
      if (local_98 == 0x1f) {
        local_a8 = 0.0;
      }
      else {
        local_a8 = *(double *)(lVar2 + (long)(local_98 + (local_94 + -1) * 0x1f) * 8);
      }
      if (local_94 == 1) {
        local_b0 = 0.0;
      }
      else {
        local_b0 = *(double *)(lVar2 + (long)(local_98 + -1 + (local_94 + -2) * 0x1f) * 8);
      }
      if (local_94 == 0x1f) {
        local_b8 = 0.0;
      }
      else {
        local_b8 = *(double *)(lVar2 + (long)(local_98 + -1 + local_94 * 0x1f) * 8);
      }
      *(double *)(lVar3 + (long)(local_98 + -1 + (local_94 + -1) * 0x1f) * 8) =
           ((local_b0 - (dVar1 + dVar1)) + local_b8) * 1024.0 +
           ((local_a8 - (dVar1 + dVar1)) + local_a0) * 1024.0;
    }
  }
  return 0;
}

Assistant:

static int jactimes(N_Vector v, N_Vector Jv, N_Vector u, sunbooleantype* new_u,
                    void* user_data)
{
  sunrealtype dx, dy, hdiff, vdiff;
  sunrealtype hdc, vdc;
  sunrealtype vij, vdn, vup, vlt, vrt;
  sunrealtype *vdata, *Jvdata;

  int i, j;

  dx  = ONE / (NX + 1);
  dy  = ONE / (NY + 1);
  hdc = ONE / (dx * dx);
  vdc = ONE / (dy * dy);

  vdata  = N_VGetArrayPointer(v);
  Jvdata = N_VGetArrayPointer(Jv);

  for (j = 1; j <= NY; j++)
  {
    for (i = 1; i <= NX; i++)
    {
      /* Extract v at x_i, y_j and four neighboring points */

      vij = IJth(vdata, i, j);
      vdn = (j == 1) ? ZERO : IJth(vdata, i, j - 1);
      vup = (j == NY) ? ZERO : IJth(vdata, i, j + 1);
      vlt = (i == 1) ? ZERO : IJth(vdata, i - 1, j);
      vrt = (i == NX) ? ZERO : IJth(vdata, i + 1, j);

      /* Evaluate diffusion components */

      hdiff = hdc * (vlt - TWO * vij + vrt);
      vdiff = vdc * (vup - TWO * vij + vdn);

      /* Set Jv at x_i, y_j */

      IJth(Jvdata, i, j) = hdiff + vdiff;
    }
  }

  return (0);
}